

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AssociativeArrayType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssociativeArrayType,slang::ast::Type_const&,slang::ast::Type_const*const&>
          (BumpAllocator *this,Type *args,Type **args_1)

{
  AssociativeArrayType *this_00;
  
  this_00 = (AssociativeArrayType *)allocate(this,0x58,8);
  ast::AssociativeArrayType::AssociativeArrayType(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }